

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModelValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)555>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar2;
  CustomModel *pCVar3;
  long *plVar4;
  Node *pNVar5;
  void **ppvVar6;
  _Alloc_hider _Var7;
  ModelDescription *interface;
  Result result;
  const_iterator __begin1;
  undefined1 local_a0 [8];
  _Alloc_hider _Stack_98;
  undefined1 local_90 [8];
  undefined1 auStack_88 [16];
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  pointer local_20;
  
  if (format->_oneof_case_[0] != 0x22b) {
    local_78 = (undefined1  [8])local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"Model not an a CustomModel.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_78);
    ppvVar6 = (void **)local_68._0_8_;
    _Var7._M_p = (pointer)local_78;
    if (local_78 == (undefined1  [8])local_68) {
      return __return_storage_ptr__;
    }
    goto LAB_0029208a;
  }
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)local_78);
  validateModelDescription((Result *)local_a0,interface,format->specificationversion_);
  local_78 = local_a0;
  std::__cxx11::string::operator=((string *)&local_70,(string *)&_Stack_98);
  if ((InnerMap *)_Stack_98._M_p != (InnerMap *)auStack_88) {
    operator_delete(_Stack_98._M_p,auStack_88._0_8_ + 1);
  }
  bVar2 = Result::good((Result *)local_78);
  if (bVar2) {
    if (format->_oneof_case_[0] == 0x22b) {
      pCVar3 = (CustomModel *)(format->Type_).pipeline_;
    }
    else {
      pCVar3 = Specification::CustomModel::default_instance();
    }
    if (((pCVar3->classname_).ptr_)->_M_string_length != 0) {
      _Stack_98._M_p = (pointer)(pCVar3->parameters_).map_.elements_;
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
      ::InnerMap::
      iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
      ::SearchFrom((iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
                    *)local_a0,((InnerMap *)_Stack_98._M_p)->index_of_first_non_null_);
      local_30._M_allocated_capacity._0_4_ = local_a0._0_4_;
      local_30._M_allocated_capacity._4_4_ = local_a0._4_4_;
      local_30._8_4_ = _Stack_98._M_p._0_4_;
      local_30._12_4_ = _Stack_98._M_p._4_4_;
      local_20 = (pointer)local_90;
      while (CONCAT44(local_30._M_allocated_capacity._4_4_,local_30._M_allocated_capacity._0_4_) !=
             0) {
        __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (CONCAT44(local_30._M_allocated_capacity._4_4_,local_30._M_allocated_capacity._0_4_
                          ) + 0x20);
        if (__rhs->_M_string_length == 0) {
          local_a0 = (undefined1  [8])local_90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,"CustomModel.parameters must have non-empty string keys.",""
                    );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
          goto LAB_00291fb4;
        }
        if (*(int *)((long)&__rhs[1].field_2 + 0xc) == 0) {
          std::operator+(&local_50,"CustomModel.parameters[\'",__rhs);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
          pNVar5 = (Node *)(plVar4 + 2);
          if ((Node *)*plVar4 == pNVar5) {
            local_90 = (undefined1  [8])(pNVar5->kv).k_._M_dataplus._M_p;
            auStack_88._0_8_ = plVar4[3];
            local_a0 = (undefined1  [8])local_90;
          }
          else {
            local_90 = (undefined1  [8])(pNVar5->kv).k_._M_dataplus._M_p;
            local_a0 = (undefined1  [8])*plVar4;
          }
          _Stack_98._M_p = (pointer)plVar4[1];
          *plVar4 = (long)pNVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
          if (local_a0 != (undefined1  [8])local_90) {
            operator_delete((void *)local_a0,(ulong)((long)local_90 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00292077;
          goto LAB_0029206f;
        }
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
        ::InnerMap::
        iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
        ::operator++((iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
                      *)&local_30);
      }
      goto LAB_00291ef9;
    }
    local_a0 = (undefined1  [8])local_90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"CustomModel must have non-empty className.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
LAB_00291fb4:
    local_50.field_2._M_allocated_capacity = (size_type)local_90;
    local_50._M_dataplus._M_p = (pointer)local_a0;
    if (local_a0 != (undefined1  [8])local_90) {
LAB_0029206f:
      operator_delete(local_50._M_dataplus._M_p,(ulong)(local_50.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  else {
LAB_00291ef9:
    __return_storage_ptr__->m_type = local_78._0_4_;
    __return_storage_ptr__->m_reason = local_78._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if (local_70._M_p == local_68 + 8) {
      paVar1->_M_allocated_capacity = CONCAT71(local_68._9_7_,local_68[8]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_68._16_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_70._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_68._9_7_,local_68[8]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_68._0_8_;
    local_68._0_8_ = (void **)0x0;
    local_68[8] = '\0';
    local_70._M_p = local_68 + 8;
  }
LAB_00292077:
  if (local_70._M_p == local_68 + 8) {
    return __return_storage_ptr__;
  }
  ppvVar6 = (void **)CONCAT71(local_68._9_7_,local_68[8]);
  _Var7._M_p = local_70._M_p;
LAB_0029208a:
  operator_delete(_Var7._M_p,(long)ppvVar6 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_customModel>(const Specification::Model& format) {
        const auto& interface = format.description();

        // Make sure that if there is a double output type, there is exactly one output index selected.
        if(!format.has_custommodel()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an a CustomModel.");
        }
        
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        const auto& customModel = format.custommodel();

        if (customModel.classname().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "CustomModel must have non-empty className.");
        }

        const auto& parameters = customModel.parameters();
        for(const auto& param : parameters) {
            if (param.first.empty()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "CustomModel.parameters must have non-empty string keys.");
            }

            switch (param.second.value_case()) {
                case Specification::CustomModel_CustomModelParamValue::VALUE_NOT_SET:
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "CustomModel.parameters['"+param.first+"'] does not have a set value");
                default:
                    break;
            }
        }

        return result;
    }